

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-file.cc
# Opt level: O3

void __thiscall PcapFile::HandleFragment(PcapFile *this,shared_ptr<Ipv4Packet> *ipv4p,istream *is)

{
  pointer psVar1;
  Ipv4Fragment *pIVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  uint8_t uVar4;
  ostream *poVar5;
  vector<std::shared_ptr<Ipv4Fragment>,std::allocator<std::shared_ptr<Ipv4Fragment>>> *this_01;
  pointer psVar6;
  iterator __position;
  shared_ptr<EigrpPacket> eigrpp;
  stringstream ss;
  undefined1 local_229;
  EigrpPacket *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  uint16_t local_212;
  shared_ptr<Ipv4Fragment> local_210;
  shared_ptr<Packet> local_200;
  shared_ptr<Ipv4Packet> local_1f0;
  shared_ptr<Ipv4Packet> local_1e0;
  pointer local_1d0;
  vector<std::shared_ptr<Ipv4Fragment>,std::allocator<std::shared_ptr<Ipv4Fragment>>> *local_1c8;
  istream *local_1c0;
  shared_ptr<Ipv4Fragment> local_1b8 [8];
  ios_base local_138 [264];
  
  psVar6 = (this->fragments).
           super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->fragments).
           super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = (vector<std::shared_ptr<Ipv4Fragment>,std::allocator<std::shared_ptr<Ipv4Fragment>>> *)
            &this->fragments;
  local_1c0 = is;
  if (psVar6 != psVar1) {
    local_1d0 = psVar1;
    local_1c8 = (vector<std::shared_ptr<Ipv4Fragment>,std::allocator<std::shared_ptr<Ipv4Fragment>>>
                 *)&this->fragments;
    do {
      pIVar2 = (psVar6->super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_1e0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (ipv4p->super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_1e0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (ipv4p->super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_1e0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1e0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1e0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1e0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1e0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar3 = Ipv4Fragment::IsSameIpPacket(pIVar2,&local_1e0);
      if (local_1e0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      psVar1 = (this->fragments).
               super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __position._M_current = psVar6;
    } while ((!bVar3) && (psVar6 = psVar6 + 1, __position._M_current = local_1d0, psVar6 != psVar1))
    ;
    this_01 = local_1c8;
    if (__position._M_current != psVar1) goto LAB_00117035;
  }
  local_1b8[0].super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Ipv4Fragment,std::allocator<Ipv4Fragment>,std::shared_ptr<Ipv4Packet>&>
            (&local_1b8[0].super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Ipv4Fragment **)local_1b8,(allocator<Ipv4Fragment> *)&local_228,ipv4p);
  std::vector<std::shared_ptr<Ipv4Fragment>,std::allocator<std::shared_ptr<Ipv4Fragment>>>::
  emplace_back<std::shared_ptr<Ipv4Fragment>>(this_01,local_1b8);
  if (local_1b8[0].super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8[0].super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  __position._M_current =
       (this->fragments).
       super__Vector_base<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_00117035:
  pIVar2 = ((__position._M_current)->super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  this_00 = ((__position._M_current)->super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_1f0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ipv4p->super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1f0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (ipv4p->super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_1f0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1f0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1f0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1f0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_1f0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Ipv4Fragment::Add(pIVar2,&local_1f0,local_1c0);
  if (local_1f0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f0.super___shared_ptr<Ipv4Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  bVar3 = Ipv4Fragment::IsComplete(pIVar2);
  if (bVar3) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    Ipv4Fragment::get_data(pIVar2,(stringstream *)local_1b8);
    uVar4 = Ipv4Fragment::get_protocol(pIVar2);
    if (uVar4 == 'X') {
      local_212 = Ipv4Fragment::get_tlen(pIVar2);
      local_228 = (EigrpPacket *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<EigrpPacket,std::allocator<EigrpPacket>,std::__cxx11::stringstream&,unsigned_short>
                (&local_220,&local_228,(allocator<EigrpPacket> *)&local_229,
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1b8,&local_212);
      local_200.super___shared_ptr<Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_228->super_Packet;
      local_200.super___shared_ptr<Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_220._M_pi;
      if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_210.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pIVar2;
      local_210.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this_00;
      InsertL4Packet(this,&local_200,&local_210);
      if (local_210.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_210.super___shared_ptr<Ipv4Fragment,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_200.super___shared_ptr<Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.super___shared_ptr<Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220._M_pi);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"unknow protocol: ",0x11);
      uVar4 = Ipv4Fragment::get_protocol(pIVar2);
      local_228._0_1_ = uVar4;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_228,1);
      local_228 = (EigrpPacket *)CONCAT71(local_228._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_228,1);
    }
    std::vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>::
    _M_erase((vector<std::shared_ptr<Ipv4Fragment>,_std::allocator<std::shared_ptr<Ipv4Fragment>_>_>
              *)this_01,__position);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void PcapFile::HandleFragment(std::shared_ptr<Ipv4Packet> ipv4p, std::istream& is)
{
    auto temp_iter = fragments.end();
    for (auto iter = fragments.begin(); iter != fragments.end(); ++iter)
    {
        if ((*iter)->IsSameIpPacket(ipv4p))
        {
            temp_iter = iter;
            break;
        }
    }

    if (temp_iter == fragments.end())
    {
        fragments.push_back(std::make_shared<Ipv4Fragment>(ipv4p));
        temp_iter = fragments.end() - 1;
    }

    auto frag = *temp_iter;
    frag->Add(ipv4p, is);

    if (frag->IsComplete())
    {
        //将完整的ip包数据提取出来
        std::stringstream ss;
        frag->get_data(ss);
        if (frag->get_protocol() == 88)  // eigrp
        {
            auto eigrpp = std::make_shared<EigrpPacket>(ss, frag->get_tlen());
            InsertL4Packet(eigrpp, frag);
        }
        else
        {
            std::cout << "unknow protocol: " << frag->get_protocol() << '\n';
        }
        //将用完的fragment删掉，节省空间和时间
        fragments.erase(temp_iter);
    }
}